

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

void __thiscall icu_63::UnicodeSet::~UnicodeSet(UnicodeSet *this)

{
  ~UnicodeSet((UnicodeSet *)&this[-1].fFlags);
  return;
}

Assistant:

UnicodeSet::~UnicodeSet() {
    _dbgdt(this); // first!
    uprv_free(list);
    delete bmpSet;
    if (buffer) {
        uprv_free(buffer);
    }
    delete strings;
    delete stringSpan;
    releasePattern();
}